

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O3

void __thiscall
CKey::
Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CKey *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          pbegin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 pend,bool fCompressedIn)

{
  long lVar1;
  array<unsigned_char,_32UL> *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)pend._M_current - (long)pbegin._M_current == 0x20) {
    bVar6 = Check(pbegin._M_current);
    if (!bVar6) goto LAB_0035d506;
    MakeKeyData(this);
    paVar2 = (this->keydata)._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    uVar3 = *(undefined8 *)pbegin._M_current;
    uVar4 = *(undefined8 *)(pbegin._M_current + 8);
    uVar5 = *(undefined8 *)(pbegin._M_current + 0x18);
    *(undefined8 *)(paVar2->_M_elems + 0x10) = *(undefined8 *)(pbegin._M_current + 0x10);
    *(undefined8 *)(paVar2->_M_elems + 0x18) = uVar5;
    *(undefined8 *)paVar2->_M_elems = uVar3;
    *(undefined8 *)(paVar2->_M_elems + 8) = uVar4;
    this->fCompressed = fCompressedIn;
  }
  else {
LAB_0035d506:
    paVar2 = (this->keydata)._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    (this->keydata)._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (array<unsigned_char,_32UL> *)0x0;
    if (paVar2 != (array<unsigned_char,_32UL> *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&this->keydata,paVar2);
        return;
      }
      goto LAB_0035d554;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0035d554:
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend, bool fCompressedIn)
    {
        if (size_t(pend - pbegin) != std::tuple_size_v<KeyType>) {
            ClearKeyData();
        } else if (Check(UCharCast(&pbegin[0]))) {
            MakeKeyData();
            memcpy(keydata->data(), (unsigned char*)&pbegin[0], keydata->size());
            fCompressed = fCompressedIn;
        } else {
            ClearKeyData();
        }
    }